

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  buffer<char> *pbVar2;
  int iVar3;
  result rVar4;
  long lVar5;
  int iVar6;
  char cVar7;
  ulong uVar9;
  size_t __len;
  ulong remainder;
  uint64_t error;
  int exp;
  grisu_shortest_handler handler;
  int local_64;
  buffer<char> *local_60;
  longdouble local_54;
  grisu_shortest_handler local_48;
  char cVar8;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x431,"value is negative");
  }
  uVar9 = (ulong)(uint)precision;
  if (value <= (longdouble)0) {
    if (precision < 1 || ((ulong)specs & 0xff00000000) != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      iVar3 = 0;
    }
    else {
      if (buf->capacity_ < uVar9) {
        (**buf->_vptr_buffer)(buf,uVar9);
      }
      buf->size_ = uVar9;
      memset(buf->ptr_,0x30,uVar9);
      iVar3 = -precision;
    }
  }
  else if (((ulong)specs >> 0x33 & 1) == 0) {
    iVar3 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  else {
    local_64 = 0;
    if (precision < 0) {
      remainder = 0x26604b7a84467;
      local_48.buf = buf->ptr_;
      local_48.size = 0;
      local_48.diff = 0x465e6604b7a84467;
      local_64 = 4;
      uVar9 = 0x1197;
      iVar3 = 0x12aab0;
      local_54 = value;
      local_60 = buf;
      do {
        lVar5 = (long)local_64;
        cVar8 = '\0';
        cVar7 = '\0';
        switch(local_64) {
        case 1:
          cVar7 = (char)uVar9;
          uVar9 = 0;
          goto switchD_00112f56_caseD_a;
        case 2:
          cVar7 = (char)(uVar9 / 10);
          iVar6 = (int)(uVar9 / 10) * 10;
          break;
        case 3:
          cVar7 = (char)(uVar9 / 100);
          iVar6 = (int)(uVar9 / 100) * 100;
          break;
        case 4:
          iVar6 = (int)(uVar9 / 1000) * 1000;
          cVar7 = (char)(uVar9 / 1000);
          break;
        case 5:
          iVar6 = (int)(uVar9 / 10000) * 10000;
          cVar7 = '\0';
          break;
        case 6:
          iVar6 = (int)(uVar9 / 100000) * 100000;
          cVar7 = '\0';
          break;
        case 7:
          iVar6 = (int)(uVar9 / 1000000) * 1000000;
          cVar7 = cVar8;
          break;
        case 8:
          iVar6 = (int)(uVar9 / 10000000) * 10000000;
          cVar7 = cVar8;
          break;
        case 9:
          iVar6 = (int)(uVar9 / 100000000) * 100000000;
          cVar7 = cVar8;
          break;
        case 10:
          goto switchD_00112f56_caseD_a;
        default:
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                      ,0x363,"invalid number of digits");
        }
        uVar9 = (ulong)(uint)((int)uVar9 - iVar6);
switchD_00112f56_caseD_a:
        local_64 = local_64 + -1;
        rVar4 = grisu_shortest_handler::on_digit
                          (&local_48,cVar7 + '0',
                           *(long *)(
                                    "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                    + lVar5 * 8 + 0x18) << 0x32,uVar9 << 0x32 | 0x26604b7a84467,2,
                           local_64,true);
        buf = (buffer<char> *)((ulong)buf & 0xffffffff);
        if (rVar4 != more) {
          buf = (buffer<char> *)(ulong)rVar4;
        }
        iVar6 = (int)buf;
        if (rVar4 != more) goto LAB_001130cb;
      } while (0 < local_64);
      error = 2;
      iVar3 = -2;
      do {
        uVar9 = remainder * 10;
        error = error * 10;
        remainder = uVar9 & 0x3fffffffffffe;
        local_64 = local_64 + -1;
        rVar4 = grisu_shortest_handler::on_digit
                          (&local_48,(byte)(uVar9 >> 0x32) | 0x30,0x4000000000000,remainder,error,
                           local_64,false);
        if (rVar4 != more) {
          buf = (buffer<char> *)(ulong)rVar4;
        }
        iVar6 = (int)buf;
      } while (rVar4 == more);
LAB_001130cb:
      pbVar2 = local_60;
      uVar9 = (ulong)(uint)local_48.size;
      if (iVar6 == 2) {
        local_64 = local_64 + local_48.size + 0xb;
        fallback_format<long_double>(local_54,local_60,&local_64);
        iVar3 = local_64;
      }
      else {
        if (local_48.size < 0) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/core.h"
                      ,0x13d,"negative value");
        }
        if (local_60->capacity_ < uVar9) {
          (**local_60->_vptr_buffer)(local_60,uVar9);
        }
        pbVar2->size_ = uVar9;
      }
      if (iVar6 != 2) {
        iVar3 = local_64 + 0xc;
      }
    }
    else {
      if (precision < 0x12) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x330,"");
      }
      iVar3 = snprintf_float<long_double>(value,precision,specs,buf);
    }
  }
  return iVar3;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}